

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int CVmObjFileName::s_getp_fromUniversal(vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t obj;
  char *pcVar2;
  int *in_RSI;
  vm_val_t *in_RDI;
  char *str;
  uint argc;
  size_t in_stack_000000a8;
  char *in_stack_000000b0;
  vm_val_t *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  vm_val_t *in_stack_ffffffffffffffb8;
  int local_3c;
  
  if (in_RSI == (int *)0x0) {
    local_3c = 0;
  }
  else {
    local_3c = *in_RSI;
  }
  if ((s_getp_fromUniversal(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&s_getp_fromUniversal(vm_val_t*,unsigned_int*)::desc), iVar1 != 0)
     ) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&s_getp_fromUniversal::desc,1);
    __cxa_guard_release(&s_getp_fromUniversal(vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    CVmStack::get(0);
    pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffffa8);
    if (pcVar2 == (char *)0x0) {
      err_throw(0);
    }
    vmb_get_len((char *)0x33d03a);
    obj = create_from_url(in_stack_000000b0,in_stack_000000a8);
    vm_val_t::set_obj(in_RDI,obj);
    CVmStack::discard(local_3c);
  }
  return 1;
}

Assistant:

int CVmObjFileName::s_getp_fromUniversal(VMG_ vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename argument as a string */
    const char *str = G_stk->get(0)->get_as_string(vmg0_);
    if (str == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* create and return the new FileName from the url syntax */
    retval->set_obj(create_from_url(vmg_ str + VMB_LEN, vmb_get_len(str)));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}